

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O2

void __thiscall
vkt::ssbo::ShaderInterface::getNamedStructs
          (ShaderInterface *this,
          vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> *structs)

{
  pointer __x;
  
  for (__x = (this->m_structs).
             super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      __x != (this->m_structs).
             super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>._M_impl.
             super__Vector_impl_data._M_finish; __x = __x + 1) {
    if ((((*__x)->m_typeName)._M_string_length != 0) &&
       (((*__x)->m_typeName)._M_dataplus._M_p != (pointer)0x0)) {
      std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>::push_back
                (structs,__x);
    }
  }
  return;
}

Assistant:

void ShaderInterface::getNamedStructs (std::vector<const StructType*>& structs) const
{
	for (std::vector<StructType*>::const_iterator i = m_structs.begin(); i != m_structs.end(); i++)
	{
		if ((*i)->getTypeName() != DE_NULL)
			structs.push_back(*i);
	}
}